

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall jsonip::writer<false>::pre(writer<false> *this)

{
  if (this->comma == true) {
    std::operator<<(this->os,", ");
    return;
  }
  return;
}

Assistant:

void pre()
        {
            if (indent_)
            {
                if (comma)
                    os << "," << '\n' << indent();
            }
            else
            {
                if (comma)
                    os << ", ";
            }
        }